

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O3

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::get_attributes
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataDBImpl *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
  it;
  Attribute local_60;
  long *local_58 [2];
  long local_48 [2];
  Node *local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_attribute_lock);
  if (iVar1 == 0) {
    (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::reserve
              (__return_storage_ptr__,
               (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var2 = (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        local_58[0] = local_48;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,*(long *)(p_Var2 + 1),
                   (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
        local_38 = *(Node **)(p_Var2 + 2);
        local_60 = Attribute::make_attribute(local_38);
        std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::
        emplace_back<cali::Attribute>(__return_storage_ptr__,&local_60);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_attribute_lock);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

std::vector<Attribute> get_attributes() const
    {
        std::lock_guard<std::mutex> g(m_attribute_lock);

        std::vector<Attribute> ret;
        ret.reserve(m_attributes.size());

        for (auto it : m_attributes)
            ret.push_back(Attribute::make_attribute(it.second));

        return ret;
    }